

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_encoding.cc
# Opt level: O1

bool draco::EncodeRawSymbols<draco::RAnsSymbolEncoder>
               (uint32_t *symbols,int num_values,uint32_t max_entry_value,int32_t num_unique_symbols
               ,Options *options,EncoderBuffer *target_buffer)

{
  uint32_t *symbols_00;
  int iVar1;
  uint uVar2;
  const_iterator cVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  string local_78;
  uint32_t *local_58;
  key_type local_50;
  
  uVar2 = 0x1f;
  if (num_unique_symbols != 0) {
    for (; (uint)num_unique_symbols >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  uVar4 = 1;
  if (0 < num_unique_symbols) {
    uVar4 = (uVar2 ^ 0xffffffe0) + 0x21;
  }
  if (uVar4 < 0x13) {
    local_58 = symbols;
    if (options == (Options *)0x0) {
      bVar6 = false;
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"symbol_encoding_compression_level","");
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)options,&local_50);
      bVar6 = (_Rb_tree_header *)cVar3._M_node !=
              &(options->options_)._M_t._M_impl.super__Rb_tree_header;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    iVar1 = 7;
    if (bVar6) {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"symbol_encoding_compression_level","");
      iVar1 = Options::GetInt(options,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    symbols_00 = local_58;
    uVar2 = 0xfffffffe;
    if (((3 < iVar1) && (uVar2 = 0xffffffff, 5 < iVar1)) && (uVar2 = 2, iVar1 < 10)) {
      uVar2 = (uint)(7 < iVar1);
    }
    iVar1 = 1;
    if (1 < (int)(uVar4 + uVar2)) {
      iVar1 = uVar4 + uVar2;
    }
    iVar5 = 0x12;
    if (iVar1 < 0x12) {
      iVar5 = iVar1;
    }
    local_78._M_dataplus._M_p._0_1_ = (char)iVar5;
    if (target_buffer->bit_encoder_reserved_bytes_ < 1) {
      std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                ((vector<char,std::allocator<char>> *)target_buffer,
                 (target_buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_78,
                 (undefined1 *)((long)&local_78._M_dataplus._M_p + 1));
    }
    switch(iVar1) {
    case 0:
    case 1:
      bVar6 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<1>>
                        (symbols_00,num_values,max_entry_value,target_buffer);
      break;
    case 2:
      bVar6 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<2>>
                        (symbols_00,num_values,max_entry_value,target_buffer);
      break;
    case 3:
      bVar6 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<3>>
                        (symbols_00,num_values,max_entry_value,target_buffer);
      break;
    case 4:
      bVar6 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<4>>
                        (symbols_00,num_values,max_entry_value,target_buffer);
      break;
    case 5:
      bVar6 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<5>>
                        (symbols_00,num_values,max_entry_value,target_buffer);
      break;
    case 6:
      bVar6 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<6>>
                        (symbols_00,num_values,max_entry_value,target_buffer);
      break;
    case 7:
      bVar6 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<7>>
                        (symbols_00,num_values,max_entry_value,target_buffer);
      break;
    case 8:
      bVar6 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<8>>
                        (symbols_00,num_values,max_entry_value,target_buffer);
      break;
    case 9:
      bVar6 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<9>>
                        (symbols_00,num_values,max_entry_value,target_buffer);
      break;
    case 10:
      bVar6 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<10>>
                        (symbols_00,num_values,max_entry_value,target_buffer);
      break;
    case 0xb:
      bVar6 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<11>>
                        (symbols_00,num_values,max_entry_value,target_buffer);
      break;
    case 0xc:
      bVar6 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<12>>
                        (symbols_00,num_values,max_entry_value,target_buffer);
      break;
    case 0xd:
      bVar6 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<13>>
                        (symbols_00,num_values,max_entry_value,target_buffer);
      break;
    case 0xe:
      bVar6 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<14>>
                        (symbols_00,num_values,max_entry_value,target_buffer);
      break;
    case 0xf:
      bVar6 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<15>>
                        (symbols_00,num_values,max_entry_value,target_buffer);
      break;
    case 0x10:
      bVar6 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<16>>
                        (symbols_00,num_values,max_entry_value,target_buffer);
      break;
    case 0x11:
      bVar6 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<17>>
                        (symbols_00,num_values,max_entry_value,target_buffer);
      break;
    default:
      bVar6 = EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<18>>
                        (symbols_00,num_values,max_entry_value,target_buffer);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool EncodeRawSymbols(const uint32_t *symbols, int num_values,
                      uint32_t max_entry_value, int32_t num_unique_symbols,
                      const Options *options, EncoderBuffer *target_buffer) {
  int symbol_bits = 0;
  if (num_unique_symbols > 0) {
    symbol_bits = MostSignificantBit(num_unique_symbols);
  }
  int unique_symbols_bit_length = symbol_bits + 1;
  // Currently, we don't support encoding of more than 2^18 unique symbols.
  if (unique_symbols_bit_length > kMaxRawEncodingBitLength) {
    return false;
  }
  int compression_level = kDefaultSymbolCodingCompressionLevel;
  if (options != nullptr &&
      options->IsOptionSet("symbol_encoding_compression_level")) {
    compression_level = options->GetInt("symbol_encoding_compression_level");
  }

  // Adjust the bit_length based on compression level. Lower compression levels
  // will use fewer bits while higher compression levels use more bits. Note
  // that this is going to work for all valid bit_lengths because the actual
  // number of bits allocated for rANS encoding is hard coded as:
  // std::max(12, 3 * bit_length / 2) , therefore there will be always a
  // sufficient number of bits available for all symbols.
  // See ComputeRAnsPrecisionFromUniqueSymbolsBitLength() for the formula.
  // This hardcoded equation cannot be changed without changing the bitstream.
  if (compression_level < 4) {
    unique_symbols_bit_length -= 2;
  } else if (compression_level < 6) {
    unique_symbols_bit_length -= 1;
  } else if (compression_level > 9) {
    unique_symbols_bit_length += 2;
  } else if (compression_level > 7) {
    unique_symbols_bit_length += 1;
  }
  // Clamp the bit_length to a valid range.
  unique_symbols_bit_length = std::min(std::max(1, unique_symbols_bit_length),
                                       kMaxRawEncodingBitLength);
  target_buffer->Encode(static_cast<uint8_t>(unique_symbols_bit_length));
  // Use appropriate symbol encoder based on the maximum symbol bit length.
  switch (unique_symbols_bit_length) {
    case 0:
      FALLTHROUGH_INTENDED;
    case 1:
      return EncodeRawSymbolsInternal<SymbolEncoderT<1>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 2:
      return EncodeRawSymbolsInternal<SymbolEncoderT<2>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 3:
      return EncodeRawSymbolsInternal<SymbolEncoderT<3>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 4:
      return EncodeRawSymbolsInternal<SymbolEncoderT<4>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 5:
      return EncodeRawSymbolsInternal<SymbolEncoderT<5>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 6:
      return EncodeRawSymbolsInternal<SymbolEncoderT<6>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 7:
      return EncodeRawSymbolsInternal<SymbolEncoderT<7>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 8:
      return EncodeRawSymbolsInternal<SymbolEncoderT<8>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 9:
      return EncodeRawSymbolsInternal<SymbolEncoderT<9>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 10:
      return EncodeRawSymbolsInternal<SymbolEncoderT<10>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 11:
      return EncodeRawSymbolsInternal<SymbolEncoderT<11>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 12:
      return EncodeRawSymbolsInternal<SymbolEncoderT<12>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 13:
      return EncodeRawSymbolsInternal<SymbolEncoderT<13>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 14:
      return EncodeRawSymbolsInternal<SymbolEncoderT<14>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 15:
      return EncodeRawSymbolsInternal<SymbolEncoderT<15>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 16:
      return EncodeRawSymbolsInternal<SymbolEncoderT<16>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 17:
      return EncodeRawSymbolsInternal<SymbolEncoderT<17>>(
          symbols, num_values, max_entry_value, target_buffer);
    case 18:
      return EncodeRawSymbolsInternal<SymbolEncoderT<18>>(
          symbols, num_values, max_entry_value, target_buffer);
    default:
      return false;
  }
}